

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_toupper(char *dst,int dst_sz,char *str)

{
  char cVar1;
  int local_24;
  int dst_max;
  int offset;
  char *str_local;
  int dst_sz_local;
  char *dst_local;
  
  local_24 = 0;
  for (_dst_max = str; *_dst_max != '\0' && local_24 < dst_sz + -1; _dst_max = _dst_max + 1) {
    cVar1 = sx_toupperchar(*_dst_max);
    dst[local_24] = cVar1;
    local_24 = local_24 + 1;
  }
  dst[local_24] = '\0';
  return dst;
}

Assistant:

char* sx_toupper(char* dst, int dst_sz, const char* str)
{
    int offset = 0;
    int dst_max = dst_sz - 1;
    while (*str && offset < dst_max) {
        dst[offset++] = sx_toupperchar(*str);
        ++str;
    }
    dst[offset] = '\0';
    return dst;
}